

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int loadStatTbl(sqlite3 *db,int bStat3,char *zSql1,char *zSql2,char *zDb)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  uchar *puVar4;
  Index *pIVar5;
  IndexSample *pIVar6;
  tRowcnt *ptVar7;
  void *pvVar8;
  void *__src;
  int nCol;
  Index *pIdx_1;
  char *zIndex_1;
  tRowcnt *pSpace;
  int i;
  int nByte;
  int nSample;
  Index *pIdx;
  char *zIndex;
  int nIdxCol;
  IndexSample *pSample;
  Index *pPrevIdx;
  char *zSql;
  sqlite3_stmt *pStmt;
  char *pcStack_38;
  int rc;
  char *zDb_local;
  char *zSql2_local;
  char *zSql1_local;
  sqlite3 *psStack_18;
  int bStat3_local;
  sqlite3 *db_local;
  
  zSql = (char *)0x0;
  pSample = (IndexSample *)0x0;
  pcStack_38 = zDb;
  zDb_local = zSql2;
  zSql2_local = zSql1;
  zSql1_local._4_4_ = bStat3;
  psStack_18 = db;
  pcVar3 = sqlite3MPrintf(db,zSql1,zDb);
  if (pcVar3 == (char *)0x0) {
    db_local._4_4_ = 7;
  }
  else {
    pStmt._4_4_ = sqlite3_prepare(psStack_18,pcVar3,-1,(sqlite3_stmt **)&zSql,(char **)0x0);
    sqlite3DbFree(psStack_18,pcVar3);
    if (pStmt._4_4_ == 0) {
      while (iVar2 = sqlite3_step((sqlite3_stmt *)zSql), iVar2 == 100) {
        zIndex._4_4_ = 1;
        puVar4 = sqlite3_column_text((sqlite3_stmt *)zSql,0);
        if (puVar4 != (uchar *)0x0) {
          iVar2 = sqlite3_column_int((sqlite3_stmt *)zSql,1);
          pIVar5 = findIndexOrPrimaryKey(psStack_18,(char *)puVar4,pcStack_38);
          if ((pIVar5 != (Index *)0x0) && (pIVar5->nSample == 0)) {
            if (zSql1_local._4_4_ == 0) {
              if (((pIVar5->pTable->tabFlags & 0x20) == 0) ||
                 ((*(ushort *)&pIVar5->field_0x63 & 3) != 2)) {
                uVar1 = pIVar5->nColumn;
              }
              else {
                uVar1 = pIVar5->nKeyCol;
              }
              zIndex._4_4_ = (uint)uVar1;
            }
            pIVar5->nSampleCol = zIndex._4_4_;
            pIVar6 = (IndexSample *)
                     sqlite3DbMallocZero(psStack_18,
                                         (long)(int)(iVar2 * 0x28 + zIndex._4_4_ * 0xc * iVar2 +
                                                    zIndex._4_4_ * 4));
            pIVar5->aSample = pIVar6;
            if (pIVar5->aSample == (IndexSample *)0x0) {
              sqlite3_finalize((sqlite3_stmt *)zSql);
              return 7;
            }
            pIVar5->aAvgEq = (tRowcnt *)(pIVar5->aSample + iVar2);
            zIndex_1 = (char *)((long)&pIVar5->aSample[iVar2].p + (long)(int)zIndex._4_4_ * 4);
            for (pSpace._4_4_ = 0; pSpace._4_4_ < iVar2; pSpace._4_4_ = pSpace._4_4_ + 1) {
              pIVar5->aSample[pSpace._4_4_].anEq = (tRowcnt *)zIndex_1;
              ptVar7 = (tRowcnt *)(zIndex_1 + (long)(int)zIndex._4_4_ * 4);
              pIVar5->aSample[pSpace._4_4_].anLt = ptVar7;
              pIVar5->aSample[pSpace._4_4_].anDLt = ptVar7 + (int)zIndex._4_4_;
              zIndex_1 = (char *)(ptVar7 + (int)zIndex._4_4_ + (int)zIndex._4_4_);
            }
          }
        }
      }
      pStmt._4_4_ = sqlite3_finalize((sqlite3_stmt *)zSql);
      db_local._4_4_ = pStmt._4_4_;
      if (pStmt._4_4_ == 0) {
        pcVar3 = sqlite3MPrintf(psStack_18,zDb_local,pcStack_38);
        if (pcVar3 == (char *)0x0) {
          db_local._4_4_ = 7;
        }
        else {
          pStmt._4_4_ = sqlite3_prepare(psStack_18,pcVar3,-1,(sqlite3_stmt **)&zSql,(char **)0x0);
          sqlite3DbFree(psStack_18,pcVar3);
          if (pStmt._4_4_ == 0) {
            while (iVar2 = sqlite3_step((sqlite3_stmt *)zSql), iVar2 == 100) {
              puVar4 = sqlite3_column_text((sqlite3_stmt *)zSql,0);
              if (((puVar4 != (uchar *)0x0) &&
                  (pIVar5 = findIndexOrPrimaryKey(psStack_18,(char *)puVar4,pcStack_38),
                  pIVar5 != (Index *)0x0)) &&
                 ((iVar2 = pIVar5->nSampleCol, zSql1_local._4_4_ == 0 || (iVar2 < 2)))) {
                if (pIVar5 != (Index *)pSample) {
                  initAvgEq((Index *)pSample);
                  pSample = (IndexSample *)pIVar5;
                }
                pIVar6 = pIVar5->aSample + pIVar5->nSample;
                puVar4 = sqlite3_column_text((sqlite3_stmt *)zSql,1);
                decodeIntArray((char *)puVar4,iVar2,pIVar6->anEq,(LogEst *)0x0,(Index *)0x0);
                puVar4 = sqlite3_column_text((sqlite3_stmt *)zSql,2);
                decodeIntArray((char *)puVar4,iVar2,pIVar6->anLt,(LogEst *)0x0,(Index *)0x0);
                puVar4 = sqlite3_column_text((sqlite3_stmt *)zSql,3);
                decodeIntArray((char *)puVar4,iVar2,pIVar6->anDLt,(LogEst *)0x0,(Index *)0x0);
                iVar2 = sqlite3_column_bytes((sqlite3_stmt *)zSql,4);
                pIVar6->n = iVar2;
                pvVar8 = sqlite3DbMallocZero(psStack_18,(long)(pIVar6->n + 2));
                pIVar6->p = pvVar8;
                if (pIVar6->p == (void *)0x0) {
                  sqlite3_finalize((sqlite3_stmt *)zSql);
                  return 7;
                }
                if (pIVar6->n != 0) {
                  pvVar8 = pIVar6->p;
                  __src = sqlite3_column_blob((sqlite3_stmt *)zSql,4);
                  memcpy(pvVar8,__src,(long)pIVar6->n);
                }
                pIVar5->nSample = pIVar5->nSample + 1;
              }
            }
            pStmt._4_4_ = sqlite3_finalize((sqlite3_stmt *)zSql);
            if (pStmt._4_4_ == 0) {
              initAvgEq((Index *)pSample);
            }
            db_local._4_4_ = pStmt._4_4_;
          }
          else {
            db_local._4_4_ = pStmt._4_4_;
          }
        }
      }
    }
    else {
      db_local._4_4_ = pStmt._4_4_;
    }
  }
  return db_local._4_4_;
}

Assistant:

static int loadStatTbl(
  sqlite3 *db,                  /* Database handle */
  int bStat3,                   /* Assume single column records only */
  const char *zSql1,            /* SQL statement 1 (see above) */
  const char *zSql2,            /* SQL statement 2 (see above) */
  const char *zDb               /* Database name (e.g. "main") */
){
  int rc;                       /* Result codes from subroutines */
  sqlite3_stmt *pStmt = 0;      /* An SQL statement being run */
  char *zSql;                   /* Text of the SQL statement */
  Index *pPrevIdx = 0;          /* Previous index in the loop */
  IndexSample *pSample;         /* A slot in pIdx->aSample[] */

  assert( db->lookaside.bDisable );
  zSql = sqlite3MPrintf(db, zSql1, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    int nIdxCol = 1;              /* Number of columns in stat4 records */

    char *zIndex;   /* Index name */
    Index *pIdx;    /* Pointer to the index object */
    int nSample;    /* Number of samples */
    int nByte;      /* Bytes of space required */
    int i;          /* Bytes of space required */
    tRowcnt *pSpace;

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    nSample = sqlite3_column_int(pStmt, 1);
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    assert( pIdx==0 || bStat3 || pIdx->nSample==0 );
    /* Index.nSample is non-zero at this point if data has already been
    ** loaded from the stat4 table. In this case ignore stat3 data.  */
    if( pIdx==0 || pIdx->nSample ) continue;
    if( bStat3==0 ){
      assert( !HasRowid(pIdx->pTable) || pIdx->nColumn==pIdx->nKeyCol+1 );
      if( !HasRowid(pIdx->pTable) && IsPrimaryKeyIndex(pIdx) ){
        nIdxCol = pIdx->nKeyCol;
      }else{
        nIdxCol = pIdx->nColumn;
      }
    }
    pIdx->nSampleCol = nIdxCol;
    nByte = sizeof(IndexSample) * nSample;
    nByte += sizeof(tRowcnt) * nIdxCol * 3 * nSample;
    nByte += nIdxCol * sizeof(tRowcnt);     /* Space for Index.aAvgEq[] */

    pIdx->aSample = sqlite3DbMallocZero(db, nByte);
    if( pIdx->aSample==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    pSpace = (tRowcnt*)&pIdx->aSample[nSample];
    pIdx->aAvgEq = pSpace; pSpace += nIdxCol;
    for(i=0; i<nSample; i++){
      pIdx->aSample[i].anEq = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anLt = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anDLt = pSpace; pSpace += nIdxCol;
    }
    assert( ((u8*)pSpace)-nByte==(u8*)(pIdx->aSample) );
  }
  rc = sqlite3_finalize(pStmt);
  if( rc ) return rc;

  zSql = sqlite3MPrintf(db, zSql2, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    char *zIndex;                 /* Index name */
    Index *pIdx;                  /* Pointer to the index object */
    int nCol = 1;                 /* Number of columns in index */

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    if( pIdx==0 ) continue;
    /* This next condition is true if data has already been loaded from 
    ** the sqlite_stat4 table. In this case ignore stat3 data.  */
    nCol = pIdx->nSampleCol;
    if( bStat3 && nCol>1 ) continue;
    if( pIdx!=pPrevIdx ){
      initAvgEq(pPrevIdx);
      pPrevIdx = pIdx;
    }
    pSample = &pIdx->aSample[pIdx->nSample];
    decodeIntArray((char*)sqlite3_column_text(pStmt,1),nCol,pSample->anEq,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,2),nCol,pSample->anLt,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,3),nCol,pSample->anDLt,0,0);

    /* Take a copy of the sample. Add two 0x00 bytes the end of the buffer.
    ** This is in case the sample record is corrupted. In that case, the
    ** sqlite3VdbeRecordCompare() may read up to two varints past the
    ** end of the allocated buffer before it realizes it is dealing with
    ** a corrupt record. Adding the two 0x00 bytes prevents this from causing
    ** a buffer overread.  */
    pSample->n = sqlite3_column_bytes(pStmt, 4);
    pSample->p = sqlite3DbMallocZero(db, pSample->n + 2);
    if( pSample->p==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    if( pSample->n ){
      memcpy(pSample->p, sqlite3_column_blob(pStmt, 4), pSample->n);
    }
    pIdx->nSample++;
  }
  rc = sqlite3_finalize(pStmt);
  if( rc==SQLITE_OK ) initAvgEq(pPrevIdx);
  return rc;
}